

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

bool __thiscall
el::base::utils::
AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
::operator!=(AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
             *this,AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                   *other)

{
  pointer ppCVar1;
  pointer ppCVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined1 uVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 extraout_RAX;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  undefined8 *puVar14;
  bool bVar15;
  undefined8 uVar8;
  
  iVar6 = (*(this->super_ThreadSafe)._vptr_ThreadSafe[10])();
  iVar7 = (*(other->super_ThreadSafe)._vptr_ThreadSafe[10])(other);
  bVar15 = true;
  if (CONCAT44(extraout_var,iVar6) == CONCAT44(extraout_var_00,iVar7)) {
    ppCVar1 = (this->m_list).
              super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar9 = (long)(this->m_list).
                  super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1;
    if (lVar9 == 0) {
      bVar15 = false;
    }
    else {
      uVar10 = lVar9 >> 3;
      ppCVar2 = (other->m_list).
                super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar11 = (long)(other->m_list).
                     super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3;
      uVar13 = 0;
      do {
        if (uVar11 == uVar13) {
          pcVar12 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
          uVar8 = ::std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar11);
          uVar5 = (undefined1)uVar8;
          puVar3 = *(undefined8 **)pcVar12;
          puVar4 = *(undefined8 **)((long)pcVar12 + 8);
          puVar14 = puVar3;
          if (puVar4 != puVar3) {
            do {
              if ((undefined8 *)*puVar14 != puVar14 + 2) {
                operator_delete((undefined8 *)*puVar14);
                uVar8 = extraout_RAX;
              }
              uVar5 = (undefined1)uVar8;
              puVar14 = puVar14 + 4;
            } while (puVar14 != puVar4);
            *(undefined8 **)((long)pcVar12 + 8) = puVar3;
          }
          return (bool)uVar5;
        }
        if (ppCVar1[uVar13] != ppCVar2[uVar13]) {
          return true;
        }
        uVar13 = uVar13 + 1;
      } while (uVar10 + (uVar10 == 0) != uVar13);
      bVar15 = uVar13 < uVar10;
    }
  }
  return bVar15;
}

Assistant:

bool operator!=(const AbstractRegistry<T_Ptr, Container>& other) {
    if (size() != other.size()) {
      return true;
    }
    for (std::size_t i = 0; i < m_list.size(); ++i) {
      if (m_list.at(i) != other.m_list.at(i)) {
        return true;
      }
    }
    return false;
  }